

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.h
# Opt level: O3

Variant __thiscall QUuid::variant(QUuid *this)

{
  byte bVar1;
  Variant VVar2;
  long lVar3;
  
  bVar1 = this->data4[0];
  if ((char)bVar1 < '\0') {
    VVar2 = DCE;
    if (0xbf < bVar1) {
      VVar2 = (Variant)(bVar1 >> 5);
    }
  }
  else {
    lVar3 = 8;
    VVar2 = NCS;
    do {
      if (this->data4[lVar3 + -8] != '\0') {
        return NCS;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    if ((this->data1 == 0) && (this->data2 == 0)) {
      return -(uint)(this->data3 == 0);
    }
  }
  return VVar2;
}

Assistant:

constexpr Variant variant(QT6_DECL_NEW_OVERLOAD) const noexcept
    {
        // Check the 3 MSB of data4[0]
        const quint8 var = data4[0] & 0xE0;
        if (var < 0x80)
            return isNull(QT6_CALL_NEW_OVERLOAD) ? VarUnknown : NCS;
        if (var < 0xC0)
            return DCE;
        return Variant(var >> 5); // Microsoft or Reserved
    }